

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_ManPrintBoxInfo(Au_Ntk_t *pNtk)

{
  int *piVar1;
  size_t __size;
  uint uVar2;
  Au_Man_t *pAVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  void *__s;
  long lVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  pAVar3 = pNtk->pMan;
  if (pAVar3 == (Au_Man_t *)0x0) {
    puts("There is no hierarchy information.");
    return;
  }
  uVar2 = (pAVar3->vNtks).nSize;
  uVar14 = (ulong)uVar2;
  uVar11 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar11 = uVar14;
  }
  if ((int)uVar11 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar11 << 2);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)(int)uVar2 << 2);
    }
  }
  if (1 < (int)uVar2) {
    __size = uVar14 * 4;
    lVar15 = 1;
    do {
      puVar4 = (undefined8 *)(pAVar3->vNtks).pArray[lVar15];
      if (*(int *)(puVar4 + 0xc) != 0) {
        uVar8 = (uint)uVar11;
        if ((int)(uint)uVar11 < (int)uVar2) {
          if (__s == (void *)0x0) {
            __s = malloc(__size);
          }
          else {
            __s = realloc(__s,__size);
          }
          uVar8 = uVar2;
          if (__s == (void *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
        }
        memset(__s,0,__size);
        iVar9 = *(int *)((long)puVar4 + 0x3c);
        if (0 < iVar9) {
          lVar7 = 0;
          do {
            lVar10 = (long)iVar9;
            if (lVar10 <= lVar7) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar12 = *(uint *)(puVar4[8] + lVar7 * 4);
            lVar5 = *(long *)(puVar4[0xf] + (long)((int)uVar12 >> 0xc) * 8);
            uVar13 = (ulong)((uVar12 & 0xfff) << 4);
            uVar11 = *(ulong *)(lVar5 + uVar13);
            if ((uVar11 & 0x700000000) == 0x600000000) {
              lVar5 = *(long *)(*(long *)(lVar5 + uVar13 & 0xfffffffffffffc00) + 8);
              uVar12 = (uint)uVar11;
              if (*(int *)(lVar5 + 0xc) <= (int)(uVar12 & 0x3fffffff)) goto LAB_00813230;
              puVar6 = *(undefined8 **)(*(long *)(lVar5 + 0x10) + (ulong)(uVar12 & 0x3fffffff) * 8);
              if ((puVar6 != (undefined8 *)0x0) && (puVar6 != puVar4)) {
                iVar9 = (pAVar3->vNtks).nSize;
                if ((long)iVar9 < 1) {
LAB_00813211:
                  __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcHieNew.c"
                                ,0x24c,"void Au_ManPrintBoxInfo(Au_Ntk_t *)");
                }
                lVar10 = 0;
                while ((undefined8 *)(pAVar3->vNtks).pArray[lVar10] != puVar6) {
                  lVar10 = lVar10 + 1;
                  if (iVar9 == lVar10) goto LAB_00813211;
                }
                if (iVar9 <= (int)lVar10) goto LAB_00813211;
                if ((int)uVar2 <= (int)lVar10) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                piVar1 = (int *)((long)__s + lVar10 * 4);
                *piVar1 = *piVar1 + 1;
                iVar9 = *(int *)((long)puVar4 + 0x3c);
                lVar10 = (long)iVar9;
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < lVar10);
        }
        printf("MODULE  ");
        printf("%-30s : ",*puVar4);
        printf("PI=%6d ",(ulong)*(uint *)(puVar4 + 10));
        printf("PO=%6d ",(ulong)*(uint *)((long)puVar4 + 0x54));
        printf("BB=%6d ",(ulong)*(uint *)(puVar4 + 0xc));
        printf("ND=%6d ",(ulong)*(uint *)((long)puVar4 + 100));
        putchar(10);
        uVar11 = 0;
        do {
          uVar12 = *(uint *)((long)__s + uVar11 * 4);
          if (uVar12 != 0) {
            if ((long)(pAVar3->vNtks).nSize <= (long)uVar11) {
LAB_00813230:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            printf("%15d : %s\n",(ulong)uVar12,*(pAVar3->vNtks).pArray[uVar11]);
          }
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
        uVar11 = (ulong)uVar8;
      }
      lVar15 = lVar15 + 1;
      uVar8 = (pAVar3->vNtks).nSize;
    } while (lVar15 < (int)uVar8);
    uVar14 = (ulong)uVar8;
  }
  if (__s != (void *)0x0) {
    free(__s);
    uVar14 = (ulong)(uint)(pAVar3->vNtks).nSize;
  }
  if (1 < (int)uVar14) {
    lVar15 = 1;
    do {
      puVar4 = (undefined8 *)(pAVar3->vNtks).pArray[lVar15];
      if (*(int *)(puVar4 + 0xc) == 0) {
        printf("MODULE  ");
        printf("%-30s : ",*puVar4);
        printf("PI=%6d ",(ulong)*(uint *)(puVar4 + 10));
        printf("PO=%6d ",(ulong)*(uint *)((long)puVar4 + 0x54));
        printf("BB=%6d ",(ulong)*(uint *)(puVar4 + 0xc));
        printf("ND=%6d ",(ulong)*(uint *)((long)puVar4 + 100));
        putchar(10);
        uVar14 = (ulong)(uint)(pAVar3->vNtks).nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar14);
  }
  return;
}

Assistant:

void Au_ManPrintBoxInfo( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Au_Ntk_t * pModel, * pBoxModel;
    Au_Obj_t * pObj;
    Vec_Int_t * vCounts;
    int i, k, Num;
    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return;
    }
    vMods = &pNtk->pMan->vNtks;

/*
    vMods->nSize--;
    vMods->pArray++;
    // sort models by name
    Vec_PtrSort( vMods, (int(*)())Au_NtkCompareNames );
    // swap the first model
    Num = Vec_PtrFind( vMods, pNtk );
    assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
    pBoxModel = (Au_Ntk_t *)Vec_PtrEntry(vMods, 0);
    Vec_PtrWriteEntry(vMods, 0, (Au_Ntk_t *)Vec_PtrEntry(vMods, Num) );
    Vec_PtrWriteEntry(vMods, Num, pBoxModel );
    vMods->pArray--;
    vMods->nSize++;
*/

//    Vec_PtrForEachEntry( Au_Ntk_t *, vMods, pModel, i )
//        printf( "%s\n", Au_NtkName(pModel) );

    // print models
    vCounts = Vec_IntStart( Vec_PtrSize(vMods) );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        if ( Au_NtkBoxNum(pModel) == 0 )
            continue;
        Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
        Au_NtkForEachBox( pModel, pObj, k )
        {
            pBoxModel = Au_ObjModel(pObj);
            if ( pBoxModel == NULL || pBoxModel == pModel )
                continue;
            Num = Vec_PtrFind( vMods, pBoxModel );
            assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
            Vec_IntAddToEntry( vCounts, Num, 1 );
        }

//        Au_NtkPrintStats( pModel, 0, 0, 0, 0, 0, 0, 0 );
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) ); // sans constants
//        printf( "Lev=%5d ", Au_NtkLevel(pModel) );
        printf( "\n" );

        Vec_IntForEachEntry( vCounts, Num, k )
            if ( Num )
                printf( "%15d : %s\n", Num, Au_NtkName((Au_Ntk_t *)Vec_PtrEntry(vMods, k)) );
    }
    Vec_IntFree( vCounts );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        if ( Au_NtkBoxNum(pModel) != 0 )
            continue;
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) );
//        printf( "Lev=%5d ", Au_NtkLevel(pModel) );
        printf( "\n" );
    }
}